

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O1

int lws_tls_openssl_cert_info
              (X509 *x509,lws_tls_cert_info type,lws_tls_cert_info_results *buf,size_t len)

{
  char *buf_00;
  int num;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  X509_PUBKEY *pXVar4;
  uchar *__src;
  ASN1_TIME *as;
  time_t tVar5;
  X509_NAME *pXVar6;
  size_t sVar7;
  uint8_t *ptmp;
  uchar *local_38;
  
  iVar1 = -1;
  if (x509 == (X509 *)0x0) {
    return -1;
  }
  switch(type) {
  case LWS_TLS_CERT_INFO_VALIDITY_FROM:
    as = (ASN1_TIME *)X509_getm_notBefore(x509);
    break;
  case LWS_TLS_CERT_INFO_VALIDITY_TO:
    as = (ASN1_TIME *)X509_getm_notAfter(x509);
    break;
  case LWS_TLS_CERT_INFO_COMMON_NAME:
    pXVar6 = X509_get_subject_name((X509 *)x509);
    if (pXVar6 == (X509_NAME *)0x0) {
      return -1;
    }
    buf_00 = (buf->ns).name;
    X509_NAME_oneline(pXVar6,buf_00,(int)len + -2);
    pcVar3 = strstr(buf_00,"/CN=");
    if (pcVar3 != (char *)0x0) {
      sVar7 = strlen(pcVar3 + 4);
      memmove(buf_00,pcVar3 + 4,sVar7 + 1);
    }
    goto LAB_0012704f;
  case LWS_TLS_CERT_INFO_ISSUER_NAME:
    pXVar6 = X509_get_issuer_name((X509 *)x509);
    if (pXVar6 == (X509_NAME *)0x0) {
      return -1;
    }
    X509_NAME_oneline(pXVar6,(buf->ns).name,(int)len + -1);
LAB_0012704f:
    sVar7 = strlen((buf->ns).name);
    buf->verified = (uint)sVar7;
    goto LAB_00127065;
  case LWS_TLS_CERT_INFO_USAGE:
    uVar2 = X509_get_key_usage(x509);
    buf->verified = uVar2;
    goto LAB_00127065;
  default:
    goto switchD_00126ef3_caseD_5;
  case LWS_TLS_CERT_INFO_OPAQUE_PUBLIC_KEY:
    pXVar4 = (X509_PUBKEY *)X509_get_X509_PUBKEY(x509);
    num = i2d_X509_PUBKEY(pXVar4,(uchar **)0x0);
    iVar1 = -1;
    if (((ulong)(long)num <= len && num != 0) &&
       (__src = (uchar *)CRYPTO_malloc(num,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-x509.c"
                                       ,0x90), __src != (uchar *)0x0)) {
      local_38 = __src;
      pXVar4 = (X509_PUBKEY *)X509_get_X509_PUBKEY(x509);
      iVar1 = i2d_X509_PUBKEY(pXVar4,&local_38);
      if ((iVar1 == num) && ((local_38 != (uchar *)0x0 && (num == (int)local_38 - (int)__src)))) {
        (buf->ns).len = num;
        memcpy((buf->ns).name,__src,(long)num);
        iVar1 = 0;
      }
      else {
        _lws_log(8,"%s: cert public key extraction failed\n","lws_tls_openssl_cert_info");
        iVar1 = -1;
        if (local_38 == (uchar *)0x0) {
          return -1;
        }
      }
      CRYPTO_free(__src);
    }
    goto switchD_00126ef3_caseD_5;
  }
  tVar5 = lws_tls_openssl_asn1time_to_unix(as);
  buf->time = tVar5;
  if (tVar5 != -1) {
LAB_00127065:
    iVar1 = 0;
  }
switchD_00126ef3_caseD_5:
  return iVar1;
}

Assistant:

int
lws_tls_openssl_cert_info(X509 *x509, enum lws_tls_cert_info type,
			  union lws_tls_cert_info_results *buf, size_t len)
{
	X509_NAME *xn;
#if !defined(LWS_PLAT_OPTEE)
	char *p;
#endif

	if (!x509)
		return -1;

#if OPENSSL_VERSION_NUMBER >= 0x10100000L && !defined(X509_get_notBefore)
#define X509_get_notBefore(x)	X509_getm_notBefore(x)
#define X509_get_notAfter(x)	X509_getm_notAfter(x)
#endif

	switch (type) {
	case LWS_TLS_CERT_INFO_VALIDITY_FROM:
		buf->time = lws_tls_openssl_asn1time_to_unix(
					X509_get_notBefore(x509));
		if (buf->time == (time_t)-1)
			return -1;
		break;

	case LWS_TLS_CERT_INFO_VALIDITY_TO:
		buf->time = lws_tls_openssl_asn1time_to_unix(
					X509_get_notAfter(x509));
		if (buf->time == (time_t)-1)
			return -1;
		break;

	case LWS_TLS_CERT_INFO_COMMON_NAME:
#if defined(LWS_PLAT_OPTEE)
		return -1;
#else
		xn = X509_get_subject_name(x509);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, buf->ns.name, (int)len - 2);
		p = strstr(buf->ns.name, "/CN=");
		if (p)
			memmove(buf->ns.name, p + 4, strlen(p + 4) + 1);
		buf->ns.len = (int)strlen(buf->ns.name);
		return 0;
#endif
	case LWS_TLS_CERT_INFO_ISSUER_NAME:
		xn = X509_get_issuer_name(x509);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, buf->ns.name, (int)len - 1);
		buf->ns.len = (int)strlen(buf->ns.name);
		return 0;

	case LWS_TLS_CERT_INFO_USAGE:
#if defined(LWS_HAVE_X509_get_key_usage)
		buf->usage = X509_get_key_usage(x509);
		break;
#else
		return -1;
#endif

	case LWS_TLS_CERT_INFO_OPAQUE_PUBLIC_KEY:
	{
#ifndef USE_WOLFSSL
		size_t klen = i2d_X509_PUBKEY(X509_get_X509_PUBKEY(x509), NULL);
		uint8_t *tmp, *ptmp;

		if (!klen || klen > len)
			return -1;

		tmp = (uint8_t *)OPENSSL_malloc(klen);
		if (!tmp)
			return -1;

		ptmp = tmp;
		if (i2d_X509_PUBKEY(
			      X509_get_X509_PUBKEY(x509), &ptmp) != (int)klen ||
		    !ptmp || lws_ptr_diff(ptmp, tmp) != (int)klen) {
			lwsl_info("%s: cert public key extraction failed\n",
				  __func__);
			if (ptmp)
				OPENSSL_free(tmp);

			return -1;
		}

		buf->ns.len = (int)klen;
		memcpy(buf->ns.name, tmp, klen);
		OPENSSL_free(tmp);
#endif
		return 0;
	}
	default:
		return -1;
	}

	return 0;
}